

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckHandler.cxx
# Opt level: O0

void __thiscall
cmCTestMemCheckHandler::PopulateCustomVectors(cmCTestMemCheckHandler *this,cmMakefile *mf)

{
  cmCTest *pcVar1;
  cmMakefile *pcVar2;
  string *psVar3;
  char *value;
  string local_c0 [8];
  string cmake;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  cmMakefile *local_18;
  cmMakefile *mf_local;
  cmCTestMemCheckHandler *this_local;
  
  local_18 = mf;
  mf_local = (cmMakefile *)this;
  cmCTestTestHandler::PopulateCustomVectors(&this->super_cmCTestTestHandler,mf);
  pcVar2 = local_18;
  pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"CTEST_CUSTOM_PRE_MEMCHECK",&local_39);
  cmCTest::PopulateCustomVector(pcVar1,pcVar2,&local_38,&this->CustomPreMemCheck);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  pcVar2 = local_18;
  pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"CTEST_CUSTOM_POST_MEMCHECK",&local_71);
  cmCTest::PopulateCustomVector(pcVar1,pcVar2,&local_70,&this->CustomPostMemCheck);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  pcVar2 = local_18;
  pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"CTEST_CUSTOM_MEMCHECK_IGNORE",
             (allocator<char> *)(cmake.field_2._M_local_buf + 0xf));
  cmCTest::PopulateCustomVector
            (pcVar1,pcVar2,&local_98,&(this->super_cmCTestTestHandler).CustomTestsIgnore);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)(cmake.field_2._M_local_buf + 0xf));
  psVar3 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
  std::__cxx11::string::string(local_c0,(string *)psVar3);
  pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  value = (char *)std::__cxx11::string::c_str();
  cmCTest::SetCTestConfiguration
            (pcVar1,"CMakeCommand",value,
             (bool)((this->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet & 1));
  std::__cxx11::string::~string(local_c0);
  return;
}

Assistant:

void cmCTestMemCheckHandler::PopulateCustomVectors(cmMakefile* mf)
{
  this->cmCTestTestHandler::PopulateCustomVectors(mf);
  this->CTest->PopulateCustomVector(mf, "CTEST_CUSTOM_PRE_MEMCHECK",
                                    this->CustomPreMemCheck);
  this->CTest->PopulateCustomVector(mf, "CTEST_CUSTOM_POST_MEMCHECK",
                                    this->CustomPostMemCheck);

  this->CTest->PopulateCustomVector(mf, "CTEST_CUSTOM_MEMCHECK_IGNORE",
                                    this->CustomTestsIgnore);
  std::string cmake = cmSystemTools::GetCMakeCommand();
  this->CTest->SetCTestConfiguration("CMakeCommand", cmake.c_str(),
                                     this->Quiet);
}